

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

void match(int matches,long limit,int num_robots,string *command1,string *command2,string *command3,
          string *command4,bool outputToStdout,bool outputToFullScreen)

{
  ulong uVar1;
  pointer p_Var2;
  _Result<void> *p_Var3;
  pointer p_Var4;
  pointer p_Var5;
  pointer p_Var6;
  pointer p_Var7;
  ulong uVar8;
  ulong uVar9;
  robot *prVar10;
  missile *pmVar11;
  int i;
  int iVar12;
  long lVar13;
  uint uVar14;
  _State_baseV2 *__tmp_1;
  future<void> *this;
  _State_baseV2 *__tmp;
  long lVar15;
  missile (*pamVar16) [2];
  int *piVar17;
  bool bVar18;
  __allocator_type __a2_1;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_2178;
  __state_type local_2168;
  char local_2149;
  undefined8 local_2148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2140;
  __allocator_type __a2;
  __allocator_type __a2_2;
  __allocator_type __a2_4;
  __allocator_type __a2_6;
  __basic_future<void> local_2130;
  uint local_211c;
  ulong local_2118;
  long *local_2110;
  long *local_2108;
  long *local_2100;
  long *local_20f8;
  int local_20f0;
  uint local_20ec;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_20a8;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:245:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:245:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_2098;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:257:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:257:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_2088;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:268:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:268:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_2078;
  long local_2068;
  long local_2060;
  int ties [4];
  int wins [4];
  Forth forth3;
  Forth forth2;
  Forth forth4;
  Forth forth1;
  
  local_2149 = outputToFullScreen;
  uVar1 = 0;
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  r_debug = 0;
  uVar8 = 0;
  if (0 < num_robots) {
    uVar8 = (ulong)(uint)num_robots;
  }
  local_2118 = (ulong)(uint)num_robots;
  for (; uVar8 != uVar1; uVar1 = uVar1 + 1) {
    wins[uVar1] = 0;
    ties[uVar1] = 0;
  }
  local_2060 = limit;
  if (num_robots < 2) {
    if (outputToStdout) {
      fwrite("\n\nCannot play without at least 2 robots.\n\n",0x2a,1,_stderr);
      return;
    }
  }
  else {
    if (matches < 1) {
      matches = 0;
    }
    local_20ec = matches + 1;
    local_2068 = local_2118 * 0xb8;
    uVar14 = 1;
    local_20f0 = num_robots;
    while (uVar14 != local_20ec) {
      local_211c = uVar14;
      cppforth::Forth::Forth(&forth1);
      InitForthRobot(&forth1,step);
      InsertForthToInt(&forth1,0);
      cppforth::Forth::Forth(&forth2);
      InitForthRobot(&forth2,step);
      InsertForthToInt(&forth2,1);
      cppforth::Forth::Forth(&forth3);
      InitForthRobot(&forth3,step);
      InsertForthToInt(&forth3,2);
      cppforth::Forth::Forth(&forth4);
      InitForthRobot(&forth4,step);
      InsertForthToInt(&forth4,3);
      allServersThreads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      allServersThreads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      allServersThreads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (pointer)operator_new(0x58);
      local_20a8._M_alloc = &__a2;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00156080;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_001560d0;
      local_20a8._M_ptr = p_Var2;
      p_Var3 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var3 = 0;
      *(undefined8 *)&p_Var3->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var3);
      *(_Result<void> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      *(Forth **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x38) = &forth1;
      *(string **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x40) = command1;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)0x0;
      local_2110 = (long *)operator_new(0x20);
      *local_2110 = (long)&PTR___State_00156128;
      local_2110[1] = (long)&p_Var2->_M_impl;
      local_2110[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>
                 ::_M_run;
      local_2110[3] = 0;
      std::thread::_M_start_thread(&local_2178,&local_2110,0);
      if (local_2110 != (long *)0x0) {
        (**(code **)(*local_2110 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20),
                 (thread *)&local_2178);
      std::thread::~thread((thread *)&local_2178);
      local_20a8._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_20a8);
      local_2148 = 0;
      _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_2168.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_2178._M_ptr =
           (pointer)local_2168.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var2->_M_impl;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      if (local_2168.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var2 = (pointer)operator_new(0x48);
        local_2178._M_alloc = &__a2_1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00156168;
        *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_001561b8;
        local_2178._M_ptr = (pointer)p_Var2;
        p_Var3 = (_Result<void> *)operator_new(0x10);
        *(undefined8 *)p_Var3 = 0;
        *(undefined8 *)&p_Var3->field_0x8 = 0;
        std::__future_base::_Result<void>::_Result(p_Var3);
        *(_Result<void> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        *(Forth **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = &forth1;
        *(string **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = command1;
        local_2178._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr(&local_2178);
        local_2148 = 0;
        _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2178._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_2168.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_2178._M_ptr =
             (pointer)local_2168.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)&p_Var2->_M_impl;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      }
      std::__basic_future<void>::__basic_future(&local_2130,&local_2168);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2168.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&allServersThreads,
                 (future<void> *)&local_2130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2130._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (pointer)operator_new(0x58);
      local_2098._M_alloc = &__a2_2;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00156200;
      *(undefined8 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var4->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var4->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00156250;
      local_2098._M_ptr = p_Var4;
      p_Var3 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var3 = 0;
      *(undefined8 *)&p_Var3->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var3);
      *(_Result<void> **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      *(Forth **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x38) = &forth2;
      *(string **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x40) = command2;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)0x0;
      local_2108 = (long *)operator_new(0x20);
      *local_2108 = (long)&PTR___State_001562a8;
      local_2108[1] = (long)&p_Var4->_M_impl;
      local_2108[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>
                 ::_M_run;
      local_2108[3] = 0;
      std::thread::_M_start_thread(&local_2178,&local_2108,0);
      if (local_2108 != (long *)0x0) {
        (**(code **)(*local_2108 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x20),
                 (thread *)&local_2178);
      std::thread::~thread((thread *)&local_2178);
      local_2098._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_2098);
      local_2148 = 0;
      _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_2168.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_2178._M_ptr =
           (pointer)local_2168.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var4->_M_impl;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      if (local_2168.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var5 = (pointer)operator_new(0x48);
        local_2178._M_alloc = &__a2_1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001562e8;
        *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00156338;
        local_2178._M_ptr = p_Var5;
        p_Var3 = (_Result<void> *)operator_new(0x10);
        *(undefined8 *)p_Var3 = 0;
        *(undefined8 *)&p_Var3->field_0x8 = 0;
        std::__future_base::_Result<void>::_Result(p_Var3);
        *(_Result<void> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        *(Forth **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = &forth2;
        *(string **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = command2;
        local_2178._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:245:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:245:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_2178);
        local_2148 = 0;
        _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2178._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_2168.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_2178._M_ptr =
             (pointer)local_2168.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)&p_Var5->_M_impl;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      }
      std::__basic_future<void>::__basic_future(&local_2130,&local_2168);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2168.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&allServersThreads,
                 (future<void> *)&local_2130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2130._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (pointer)operator_new(0x58);
      local_2088._M_alloc = &__a2_4;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00156380;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var6->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var6->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_001563d0;
      local_2088._M_ptr = p_Var6;
      p_Var3 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var3 = 0;
      *(undefined8 *)&p_Var3->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var3);
      *(_Result<void> **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      *(Forth **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x38) = &forth3;
      *(string **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = command3;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)0x0;
      local_2100 = (long *)operator_new(0x20);
      *local_2100 = (long)&PTR___State_00156428;
      local_2100[1] = (long)&p_Var6->_M_impl;
      local_2100[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>
                 ::_M_run;
      local_2100[3] = 0;
      std::thread::_M_start_thread(&local_2178,&local_2100,0);
      if (local_2100 != (long *)0x0) {
        (**(code **)(*local_2100 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20),
                 (thread *)&local_2178);
      std::thread::~thread((thread *)&local_2178);
      local_2088._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_2088);
      local_2148 = 0;
      _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_2168.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_2178._M_ptr =
           (pointer)local_2168.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var6->_M_impl;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      if (local_2168.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var5 = (pointer)operator_new(0x48);
        local_2178._M_alloc = &__a2_1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00156468;
        *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_001564b8;
        local_2178._M_ptr = p_Var5;
        p_Var3 = (_Result<void> *)operator_new(0x10);
        *(undefined8 *)p_Var3 = 0;
        *(undefined8 *)&p_Var3->field_0x8 = 0;
        std::__future_base::_Result<void>::_Result(p_Var3);
        *(_Result<void> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        *(Forth **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = &forth3;
        *(string **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = command3;
        local_2178._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:257:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:257:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_2178);
        local_2148 = 0;
        _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2178._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_2168.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_2178._M_ptr =
             (pointer)local_2168.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)&p_Var5->_M_impl;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      }
      std::__basic_future<void>::__basic_future(&local_2130,&local_2168);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2168.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&allServersThreads,
                 (future<void> *)&local_2130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2130._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7 = (pointer)operator_new(0x58);
      local_2078._M_alloc = &__a2_6;
      (p_Var7->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var7->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var7->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00156500;
      *(undefined8 *)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var7->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var7->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00156550;
      local_2078._M_ptr = p_Var7;
      p_Var3 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var3 = 0;
      *(undefined8 *)&p_Var3->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var3);
      *(_Result<void> **)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      *(Forth **)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x38) = &forth4;
      *(string **)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x40) = command4;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)0x0;
      local_20f8 = (long *)operator_new(0x20);
      *local_20f8 = (long)&PTR___State_001565a8;
      local_20f8[1] = (long)&p_Var7->_M_impl;
      local_20f8[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>
                 ::_M_run;
      local_20f8[3] = 0;
      std::thread::_M_start_thread(&local_2178,&local_20f8,0);
      if (local_20f8 != (long *)0x0) {
        (**(code **)(*local_20f8 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var7->_M_impl)._M_storage._M_storage + 0x20),
                 (thread *)&local_2178);
      std::thread::~thread((thread *)&local_2178);
      local_2078._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_2078);
      local_2148 = 0;
      _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2178._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_2168.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_2178._M_ptr =
           (pointer)local_2168.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var7->_M_impl;
      local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      if (local_2168.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var5 = (pointer)operator_new(0x48);
        local_2178._M_alloc = &__a2_1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001565e8;
        *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var5->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00156638;
        local_2178._M_ptr = p_Var5;
        p_Var3 = (_Result<void> *)operator_new(0x10);
        *(undefined8 *)p_Var3 = 0;
        *(undefined8 *)&p_Var3->field_0x8 = 0;
        std::__future_base::_Result<void>::_Result(p_Var3);
        *(_Result<void> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        *(Forth **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = &forth4;
        *(string **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = command4;
        local_2178._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:268:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:268:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_2178);
        local_2148 = 0;
        _Stack_2140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2178._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_2168.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_2178._M_ptr =
             (pointer)local_2168.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)&p_Var5->_M_impl;
        local_2168.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2178._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2140);
      }
      std::__basic_future<void>::__basic_future(&local_2130,&local_2168);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2168.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&allServersThreads,
                 (future<void> *)&local_2130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_2130._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (outputToStdout) {
        printf("\nMatch %6d: ",(ulong)local_211c);
      }
      prVar10 = robots;
      for (uVar1 = 0; local_2118 != uVar1; uVar1 = uVar1 + 1) {
        init_robot((int)uVar1);
        prVar10->status = 1;
        prVar10 = prVar10 + 1;
      }
      rand_pos(num_robots);
      lVar15 = 0;
      uVar8 = local_2118 & 0xffffffff;
      uVar1 = local_2118;
LAB_0010dc9b:
      iVar12 = 0xf;
      while ((1 < (int)uVar8 && (lVar15 < local_2060))) {
        uVar8 = 0;
        prVar10 = robots;
        uVar9 = uVar1;
        while (bVar18 = uVar9 != 0, uVar9 = uVar9 - 1, bVar18) {
          if (prVar10->status == 1) {
            uVar8 = (ulong)((int)uVar8 + 1);
            cur_robot = prVar10;
          }
          prVar10 = prVar10 + 1;
        }
        cycle(num_robots);
        if (local_2149 != '\0') {
          update_disp();
          local_2178._M_alloc =
               (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_VladlenPopolitov[P]ForthScriptCpp_examples_ForthRobots_ForthRobots_cpp:233:15)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
                *)0x1;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&local_2178);
        }
        iVar12 = iVar12 + -1;
        if (iVar12 == 0) goto LAB_0010dd0e;
      }
      uVar8 = 0;
      bVar18 = false;
      while( true ) {
        for (; uVar8 != uVar1; uVar8 = uVar8 + 1) {
          for (lVar13 = 0; lVar13 != 0x58; lVar13 = lVar13 + 0x2c) {
            if (*(int *)((long)&missiles[uVar8][0].stat + lVar13) == 1) {
              bVar18 = true;
            }
          }
        }
        if (!bVar18) break;
        move_robots(0);
        uVar8 = 0;
        move_miss(0);
        bVar18 = false;
      }
      if (outputToStdout) {
        printf(" cycles = %ld:\n  Survivors:\n",lVar15);
      }
      lVar15 = local_2068;
      uVar14 = 1;
      iVar12 = 0;
      for (lVar13 = 0; lVar15 != lVar13; lVar13 = lVar13 + 0xb8) {
        if (*(int *)(robots[0].name + lVar13 + -4) == 1) {
          if (outputToStdout) {
            printf("   (%d)%14s: damage=%% %d  ",(ulong)uVar14);
            putchar((lVar13 == 0xb8) + 9);
          }
          iVar12 = iVar12 + 1;
        }
        uVar14 = uVar14 + 1;
      }
      if (iVar12 == 0) {
        if (outputToStdout) {
          puts("mutual destruction");
          goto LAB_0010de68;
        }
      }
      else if (outputToStdout) {
        putchar(10);
LAB_0010de68:
        puts("  Cumulative score:");
      }
      piVar17 = ties;
      if (iVar12 == 1) {
        piVar17 = wins;
      }
      lVar15 = 0x158174;
      for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
        if (*(int *)(lVar15 + -4) == 1) {
          piVar17[uVar8] = piVar17[uVar8] + 1;
        }
        if (outputToStdout) {
          printf("   (%d)%14s: wins=%d ties=%d  ",(ulong)((int)uVar8 + 1),lVar15,
                 (ulong)(uint)wins[uVar8],(ulong)(uint)ties[uVar8]);
          putchar((uVar8 == 1) + 9);
        }
        lVar15 = lVar15 + 0xb8;
      }
      if (outputToStdout) {
        putchar(10);
      }
      LOCK();
      stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
      UNLOCK();
      for (iVar12 = 0;
          this = allServersThreads.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_start, iVar12 != 10000; iVar12 = iVar12 + 1) {
        bVar18 = true;
        for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 4) {
          bVar18 = (bool)(bVar18 & *(int *)((long)robotStatus + lVar15) == 0);
        }
        if (bVar18) break;
        cycle((int)uVar1);
        sched_yield();
      }
      for (; this != allServersThreads.
                     super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
        std::future<void>::get(this);
      }
      LOCK();
      stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                (&allServersThreads);
      cppforth::Forth::~Forth(&forth4);
      cppforth::Forth::~Forth(&forth3);
      cppforth::Forth::~Forth(&forth2);
      cppforth::Forth::~Forth(&forth1);
      uVar14 = local_211c + 1;
    }
    if (outputToStdout) {
      fwrite("\nMatch play finished.\n\n",0x17,1,_stderr);
    }
  }
  return;
LAB_0010dd0e:
  move_robots(0);
  move_miss(0);
  lVar15 = lVar15 + 0xf;
  pamVar16 = missiles;
  for (uVar9 = 0; num_robots = local_20f0, uVar9 != uVar1; uVar9 = uVar9 + 1) {
    lVar13 = 0;
    pmVar11 = *pamVar16;
    for (; lVar13 != 2; lVar13 = lVar13 + 1) {
      if (((missile *)&pmVar11->stat)->stat == 2) {
        count_miss((int)uVar9,(int)lVar13);
      }
      pmVar11 = pmVar11 + 1;
    }
    pamVar16 = (missile (*) [2])((long)pamVar16 + 0x58);
    uVar1 = local_2118;
  }
  goto LAB_0010dc9b;
}

Assistant:

void match(int matches,
long limit,
int num_robots,
const std::string &command1,
const std::string &command2,
const std::string &command3,
const std::string &command4,
bool outputToStdout=false,
bool outputToFullScreen=false
)
{
	//int num_robots = 0;
	stopAll.store(0);
	int robotsleft{};
	int m_count{};
	int movement{};
	int i{}, j{}, k{};
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}
	//num_robots=2;
	if (num_robots < 2) {
		if (outputToStdout) fprintf(stderr, "\n\nCannot play without at least 2 robots.\n\n");
		return;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);
		cppforth::Forth forth3{};
		InitForthRobot(forth3);
		InsertForthToInt(&forth3, 2);
		cppforth::Forth forth4{};
		InitForthRobot(forth4);
		InsertForthToInt(&forth4, 3);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth3, &command3]{
			try{
				robotStatus[2] = StatusRun;
				forth3.ExecuteString(command3);
				robotStatus[2] = StatusException;
			}
			catch (...){
				robotStatus[2] = StatusException;
			}
		}));
		allServersThreads.push_back(
			std::async([&forth4, &command4]{
			try{
				robotStatus[3] = StatusRun;
				forth4.ExecuteString(command4);
				robotStatus[3] = StatusException;
			}
			catch (...){
				robotStatus[3] = StatusException;
			}
		}));
		if (outputToStdout) printf("\nMatch %6d: ", m_count);
for (i = 0; i < num_robots; i++) {
	init_robot(i);
	// robot_go should be here
	robots[i].status = ACTIVE;
}
rand_pos(num_robots);
movement = MOTION_CYCLES;
robotsleft = num_robots;
counter = 0L;
while (robotsleft > 1 && counter < limit) {
	robotsleft = 0;
	for (i = 0; i < num_robots; i++) {
		if (robots[i].status == ACTIVE) {
			robotsleft++;
			cur_robot = &robots[i];
		}
	}
	cycle(num_robots);
	if (outputToFullScreen) update_disp();
	if (outputToFullScreen) std::this_thread::sleep_for(std::chrono::milliseconds(1));

	if (--movement == 0) {
		counter += MOTION_CYCLES;
		movement = MOTION_CYCLES;
		move_robots(0);
		move_miss(0);
#ifdef DOS
		kbhit();  /* check keyboard so ctrl-break can work */
#endif
		for (i = 0; i < num_robots; i++) {
			for (j = 0; j < MIS_ROBOT; j++) {
				if (missiles[i][j].stat == EXPLODING) {
					count_miss(i, j);
				}
			}
		}
	}
}

/* allow any flying missiles to explode */
while (1) {
	k = 0;
	for (i = 0; i < num_robots; i++) {
		for (j = 0; j < MIS_ROBOT; j++) {
			if (missiles[i][j].stat == FLYING) {
				k = 1;
			}
		}
	}
	if (k) {
		move_robots(0);
		move_miss(0);
	}
	else
		break;
}

if (outputToStdout) printf(" cycles = %ld:\n  Survivors:\n", counter);

k = 0;
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (outputToStdout) 
			printf("   (%d)%14s: damage=%% %d  ", i + 1, robots[i].name,
			robots[i].damage);
    if (i == 1) {
      if (outputToStdout) printf("\n");
    }
    else {
      if (outputToStdout) printf("\t");
    }
		k++;
	}
}

if (k == 0) {
	if (outputToStdout) printf("mutual destruction\n");
}
else {
	if (outputToStdout) printf("\n");
}

if (outputToStdout) printf("  Cumulative score:\n");
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (k == 1)
			wins[i]++;
		else
			ties[i]++;
	}
	if (outputToStdout) printf("   (%d)%14s: wins=%d ties=%d  ", i + 1, robots[i].name,
		wins[i], ties[i]);
  if (i == 1) {
    if (outputToStdout) printf("\n");
  }
  else {
    if (outputToStdout) printf("\t");
  }
}
if (outputToStdout) printf("\n");
stopAll.store(1);
for (int i = 0; i < 10000; ++i){
	auto end = true;
	for (j = 0; j < 4; ++j){
		if (robotStatus[j] != StatusException){
			end = false;
		}
	}
	if (end) 
		break;
	cycle(num_robots);
	std::this_thread::yield();
}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	if (outputToStdout) fprintf(stderr, "\nMatch play finished.\n\n");
	return ;

}